

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_v2valid.cpp
# Opt level: O0

bool __thiscall ON_Brep::IsValidForV2(ON_Brep *this)

{
  int i;
  int i_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ON_Curve **ppOVar4;
  ON_NurbsCurve *pOVar5;
  ON_Surface **ppOVar6;
  ON_NurbsSurface *pOVar7;
  ON_BrepTrim *pOVar8;
  ON_BrepEdge *edge;
  int *piVar9;
  double dVar10;
  ON_3dPoint local_e8;
  ON_3dPoint local_d0;
  ON_BrepLoop *local_b8;
  ON_BrepLoop *loop;
  ON_BrepFace *face;
  ON_BrepVertex *vertex;
  int trim_count;
  int loop_count;
  int face_count;
  int edge_count;
  int vertex_count;
  int s_count;
  int c3_count;
  int c2_count;
  ON_3dPoint P1;
  ON_3dPoint P0;
  int loop_trim_count;
  int next_lti;
  int lti;
  int next_ti;
  int fi;
  int vi;
  int ei;
  int li;
  int ti;
  int si;
  int c3i;
  int c2i;
  bool rc;
  ON_Brep *this_local;
  
  bVar1 = IsValidTopology(this,(ON_TextLog *)0x0);
  if ((bool)(-bVar1 & 1U) != false) {
    s_count = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>);
    vertex_count = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>)
    ;
    edge_count = ON_SimpleArray<ON_Surface_*>::Count
                           (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>);
    face_count = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
    loop_count = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E);
    trim_count = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F);
    vertex._4_4_ = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L);
    vertex._0_4_ = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T);
    for (si = 0; si < s_count; si = si + 1) {
      ppOVar4 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,si);
      pOVar5 = ON_NurbsCurve::Cast((ON_Object *)*ppOVar4);
      if (pOVar5 == (ON_NurbsCurve *)0x0) {
        return false;
      }
    }
    for (ti = 0; ti < vertex_count; ti = ti + 1) {
      ppOVar4 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,ti);
      pOVar5 = ON_NurbsCurve::Cast((ON_Object *)*ppOVar4);
      if (pOVar5 == (ON_NurbsCurve *)0x0) {
        return false;
      }
    }
    for (li = 0; li < edge_count; li = li + 1) {
      ppOVar6 = ON_SimpleArray<ON_Surface_*>::operator[]
                          (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,li);
      pOVar7 = ON_NurbsSurface::Cast((ON_Object *)*ppOVar6);
      if (pOVar7 == (ON_NurbsSurface *)0x0) {
        return false;
      }
    }
    for (next_ti = 0; next_ti < face_count; next_ti = next_ti + 1) {
      face = (ON_BrepFace *)
             ON_ClassArray<ON_BrepVertex>::operator[]
                       ((ON_ClassArray<ON_BrepVertex> *)&this->m_V,next_ti);
      if (*(int *)((long)&(face->m_li)._vptr_ON_SimpleArray + 4) != next_ti) {
        return false;
      }
    }
    for (lti = 0; lti < trim_count; lti = lti + 1) {
      loop = (ON_BrepLoop *)
             ON_ClassArray<ON_BrepFace>::operator[]((ON_ClassArray<ON_BrepFace> *)&this->m_F,lti);
      if (((ON_BrepFace *)loop)->m_face_index != lti) {
        return false;
      }
    }
    for (ei = 0; ei < (int)vertex; ei = ei + 1) {
      pOVar8 = ON_ClassArray<ON_BrepTrim>::operator[]((ON_ClassArray<ON_BrepTrim> *)&this->m_T,ei);
      bVar2 = IsValidForV2(this,pOVar8);
      if (!bVar2) {
        return false;
      }
    }
    for (fi = 0; fi < loop_count; fi = fi + 1) {
      edge = ON_ClassArray<ON_BrepEdge>::operator[]((ON_ClassArray<ON_BrepEdge> *)&this->m_E,fi);
      bVar2 = IsValidForV2(this,edge);
      if (!bVar2) {
        return false;
      }
    }
    for (vi = 0; vi < vertex._4_4_; vi = vi + 1) {
      local_b8 = ON_ClassArray<ON_BrepLoop>::operator[]((ON_ClassArray<ON_BrepLoop> *)&this->m_L,vi)
      ;
      if (local_b8->m_loop_index == -1) {
        return false;
      }
      iVar3 = ON_SimpleArray<int>::Count(&local_b8->m_ti);
      for (loop_trim_count = 0; loop_trim_count < iVar3; loop_trim_count = loop_trim_count + 1) {
        piVar9 = ON_SimpleArray<int>::operator[](&local_b8->m_ti,loop_trim_count);
        i = *piVar9;
        piVar9 = ON_SimpleArray<int>::operator[](&local_b8->m_ti,(loop_trim_count + 1) % iVar3);
        i_00 = *piVar9;
        if ((i < 0) || ((int)vertex <= i)) {
          return false;
        }
        if ((i_00 < 0) || ((int)vertex <= i_00)) {
          return false;
        }
        pOVar8 = ON_ClassArray<ON_BrepTrim>::operator[]((ON_ClassArray<ON_BrepTrim> *)&this->m_T,i);
        ON_Curve::PointAtEnd(&local_d0,(ON_Curve *)pOVar8);
        P1.z = local_d0.x;
        pOVar8 = ON_ClassArray<ON_BrepTrim>::operator[]
                           ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,i_00);
        ON_Curve::PointAtStart(&local_e8,(ON_Curve *)pOVar8);
        _c3_count = local_e8.x;
        P1.x = local_e8.y;
        P1.y = local_e8.z;
        dVar10 = ON_3dPoint::DistanceTo((ON_3dPoint *)&P1.z,(ON_3dPoint *)&c3_count);
        if (2.3283064365386963e-10 < dVar10) {
          return false;
        }
      }
    }
  }
  return (bool)(-bVar1 & 1U);
}

Assistant:

bool ON_Brep::IsValidForV2() const
{
  bool rc = IsValidTopology()?true:false;
  if ( rc )
  {
    int c2i, c3i, si, ti, li, ei, vi, fi, next_ti, lti, next_lti, loop_trim_count;
    ON_3dPoint P0, P1;

    const int c2_count = m_C2.Count();
    const int c3_count = m_C3.Count();
    const int s_count  = m_S.Count();
    const int vertex_count = m_V.Count();
    const int edge_count = m_E.Count();
    const int face_count = m_F.Count();
    const int loop_count = m_L.Count();
    const int trim_count = m_T.Count();

    for ( c2i = 0; c2i < c2_count; c2i++ )
    {
      // v2 3dm files expect NURBS curves
      if ( !ON_NurbsCurve::Cast(m_C2[c2i]) )
        return false;
    }

    for ( c3i = 0; c3i < c3_count; c3i++ )
    {
      // v2 3dm files expect NURBS curves
      if ( !ON_NurbsCurve::Cast(m_C3[c3i]) )
        return false;
    }

    for ( si = 0; si < s_count; si++ )
    {
      // v2 3dm files expect NURBS surfaces
      if ( !ON_NurbsSurface::Cast(m_S[si]) )
        return false;
    }

    for ( vi = 0; vi < vertex_count; vi++ )
    {
      const ON_BrepVertex& vertex = m_V[vi];
      if ( vertex.m_vertex_index != vi )
        return false;
    }

    for ( fi = 0; fi < face_count; fi++ )
    {
      const ON_BrepFace& face = m_F[fi];
      if ( face.m_face_index != fi )
        return false;
    }

    for ( ti = 0; ti < trim_count; ti++ )
    {
      if ( !IsValidForV2( m_T[ti] ) )
        return false;
    }

    for ( ei = 0; ei < edge_count; ei++ )
    {
      if ( !IsValidForV2(m_E[ei]) )
        return false;
    }

    for ( li = 0; li < loop_count; li++ )
    {
      const ON_BrepLoop& loop = m_L[li];
      if ( loop.m_loop_index == -1 )
        return false;
      loop_trim_count = loop.m_ti.Count();
      for ( lti = 0; lti < loop_trim_count; lti++ )
      {
        next_lti = (lti+1)%loop_trim_count;
        ti = loop.m_ti[lti];
        next_ti = loop.m_ti[next_lti];
        if ( ti < 0 || ti >= trim_count )
          return false;
        if ( next_ti < 0 || next_ti >= trim_count )
          return false;
        P0 = m_T[ti].PointAtEnd();
        P1 = m_T[next_ti].PointAtStart();
        if ( P0.DistanceTo(P1) > ON_ZERO_TOLERANCE )
          return false;
      }
    }
  }

  return rc;
}